

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3SafetyCheckSickOrOk(sqlite3 *db)

{
  u32 uVar1;
  int iVar2;
  
  uVar1 = db->magic;
  iVar2 = 1;
  if (((uVar1 != 0xa029a697) && (uVar1 != 0xf03b7906)) && (uVar1 != 0x4b771290)) {
    iVar2 = 0;
    sqlite3_log(0x15,"API call with %s database connection pointer","invalid");
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3SafetyCheckSickOrOk(sqlite3 *db){
  u32 magic;
  magic = db->magic;
  if( magic!=SQLITE_MAGIC_SICK &&
      magic!=SQLITE_MAGIC_OPEN &&
      magic!=SQLITE_MAGIC_BUSY ){
    testcase( sqlite3GlobalConfig.xLog!=0 );
    logBadConnection("invalid");
    return 0;
  }else{
    return 1;
  }
}